

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# once_test.c
# Opt level: O0

void benchmark_native_once(testing t)

{
  int iVar1;
  int local_18;
  int i;
  int n;
  testing t_local;
  
  iVar1 = testing_n(t);
  for (local_18 = 0; local_18 != iVar1; local_18 = local_18 + 1) {
    nsync_pthread_once_(&benchmark_native_once::o,no_op);
  }
  return;
}

Assistant:

static void benchmark_native_once (testing t) {
	static pthread_once_t o = PTHREAD_ONCE_INIT;
	int n = testing_n (t);
	int i;
	for (i = 0; i != n; i++) {
		pthread_once (&o, &no_op);
	}
}